

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  initializer_list<cv::Mat> __l;
  reference pvVar1;
  ostream *this;
  size_type sVar2;
  reference pvVar3;
  Mat *local_500;
  allocator<cv::Mat> local_4b1;
  Mat *local_4b0;
  Mat local_4a8 [96];
  Mat local_448 [96];
  iterator local_3e8;
  size_type local_3e0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_3d8;
  string local_3c0 [8];
  Mat img1;
  string local_360 [8];
  Mat img0;
  ulong local_300;
  size_t i;
  SE3<float,_0> local_2d8;
  undefined1 local_2b8 [8];
  OpticalFlowFrameToFrame<float,_vo::Pattern51> flow;
  Transformation local_1a8;
  allocator<char> local_159;
  string local_158 [32];
  undefined1 local_138 [8];
  json j;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [55];
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c1;
  undefined1 local_c0 [8];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  filenames;
  char dataset1 [68];
  char acStack_58 [8];
  char dataset0 [68];
  
  builtin_strncpy(dataset0,"wei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png",0x3c);
  builtin_strncpy(acStack_58,"/home/po",8);
  filenames.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6f702f656d6f682f;
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(&local_c1);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_c0,2,&local_c1);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,acStack_58,&local_f9);
  pvVar1 = std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_c0,0);
  cv::glob(local_f8,pvVar1,0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,
             (char *)&filenames.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator<char> *)((long)&j.m_value + 7));
  pvVar1 = std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_c0,1);
  cv::glob(local_120,pvVar1,0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j.m_value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"../data/euroc_ds_calib.json",&local_159);
  fromFile((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  T_1_0((SE3f *)&flow.processing_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(json *)local_138);
  Sophus::SE3Base<Sophus::SE3<float,_0>_>::matrix
            (&local_1a8,
             (SE3Base<Sophus::SE3<float,_0>_> *)
             &flow.processing_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this = Eigen::operator<<((ostream *)&std::cout,
                           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&local_1a8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  T_1_0((SE3f *)&i,(json *)local_138);
  Sophus::SE3Base<Sophus::SE3<float,_0>_>::inverse(&local_2d8,(SE3Base<Sophus::SE3<float,_0>_> *)&i)
  ;
  vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::OpticalFlowFrameToFrame
            ((OpticalFlowFrameToFrame<float,_vo::Pattern51> *)local_2b8,'\x02',&local_2d8);
  local_300 = 0;
  while( true ) {
    pvVar1 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_c0,0);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar1);
    if (sVar2 <= local_300) break;
    pvVar1 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_c0,0);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar1,local_300);
    cv::imread(local_360,(int)pvVar3);
    pvVar1 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_c0,1);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar1,local_300);
    cv::imread(local_3c0,(int)pvVar3);
    local_4b0 = local_4a8;
    cv::Mat::Mat(local_4b0,(Mat *)local_360);
    local_4b0 = local_448;
    cv::Mat::Mat(local_4b0,(Mat *)local_3c0);
    local_3e8 = local_4a8;
    local_3e0 = 2;
    std::allocator<cv::Mat>::allocator(&local_4b1);
    __l._M_len = local_3e0;
    __l._M_array = local_3e8;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_3d8,__l,&local_4b1);
    vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::processFrame
              ((OpticalFlowFrameToFrame<float,_vo::Pattern51> *)local_2b8,&local_3d8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3d8);
    std::allocator<cv::Mat>::~allocator(&local_4b1);
    local_500 = (Mat *)&local_3e8;
    do {
      local_500 = local_500 + -0x60;
      cv::Mat::~Mat(local_500);
    } while (local_500 != local_4a8);
    cv::waitKey(1);
    cv::Mat::~Mat((Mat *)local_3c0);
    cv::Mat::~Mat((Mat *)local_360);
    local_300 = local_300 + 1;
  }
  vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::~OpticalFlowFrameToFrame
            ((OpticalFlowFrameToFrame<float,_vo::Pattern51> *)local_2b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_138);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_c0);
  return 0;
}

Assistant:

int main() {
  constexpr char dataset0[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png";
  constexpr char dataset1[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam1/data/*.png";
  // constexpr char dataset[] = "/Users/powei/Documents/mav0/cam0/data/*.png";
  vector<vector<string>> filenames(2);
  glob(dataset0, filenames[0]);
  glob(dataset1, filenames[1]);
  const nlohmann::json j = fromFile("../data/euroc_ds_calib.json");
  cout << T_1_0(j).matrix() << endl;

  vo::OpticalFlowFrameToFrame<float, vo::Pattern51> flow(2, T_1_0(j).inverse());

  for (size_t i = 0; i < filenames[0].size(); i++) {
    Mat img0 = imread(filenames[0][i], cv::IMREAD_UNCHANGED);
    Mat img1 = imread(filenames[1][i], cv::IMREAD_UNCHANGED);
    flow.processFrame({img0, img1});
    waitKey(1);
    // if(i>1000)
    //   break;
  }
  return 0;
}